

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiInst(Fts5Context *pCtx,int iIdx,int *piPhrase,int *piCol,int *piOff)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  if ((((byte)pCtx[0x50] & 8) != 0) && (iVar2 = fts5CacheInstArray((Fts5Cursor *)pCtx), iVar2 != 0))
  {
    return iVar2;
  }
  iVar2 = 0x19;
  if ((-1 < iIdx) && (iIdx < *(int *)(pCtx + 0xac))) {
    lVar1 = *(long *)(pCtx + 0xb0);
    uVar3 = (ulong)(uint)(iIdx * 3);
    *piPhrase = *(int *)(lVar1 + uVar3 * 4);
    *piCol = *(int *)(lVar1 + 4 + uVar3 * 4);
    *piOff = *(int *)(lVar1 + 8 + uVar3 * 4);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int fts5ApiInst(
  Fts5Context *pCtx,
  int iIdx,
  int *piPhrase,
  int *piCol,
  int *piOff
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr))
  ){
    if( iIdx<0 || iIdx>=pCsr->nInstCount ){
      rc = SQLITE_RANGE;
    }else{
      *piPhrase = pCsr->aInst[iIdx*3];
      *piCol = pCsr->aInst[iIdx*3 + 1];
      *piOff = pCsr->aInst[iIdx*3 + 2];
    }
  }
  return rc;
}